

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::range_query(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *this,pair<unsigned_long_long,_int> *keyl,pair<unsigned_long_long,_int> *keyr)

{
  long lVar1;
  bool bVar2;
  pair<unsigned_long_long,_int> *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *puVar3;
  undefined8 *extraout_RDX_02;
  undefined8 *extraout_RDX_03;
  int iVar4;
  ulong unaff_RBX;
  int iVar5;
  pair<unsigned_long_long,_int> *ppVar6;
  long unaff_R14;
  undefined1 auVar7 [16];
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> vVar8;
  locType pos;
  undefined8 local_58;
  pair<unsigned_long_long,_int> *local_50;
  pair<const_std::pair<unsigned_long_long,_int>,_long> local_48;
  
  local_50 = in_RCX;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::vector
            ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)this);
  iVar4 = (int)keyl->first;
  puVar3 = extraout_RDX;
  if (iVar4 == 0) {
LAB_0010d393:
    vVar8._8_8_ = puVar3;
    vVar8.data = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)this;
    return vVar8;
  }
  local_58 = *(undefined8 *)&keyl->second;
  puVar3 = &local_58;
  for (iVar5 = 0; iVar5 < iVar4; iVar5 = iVar5 + 1) {
    auVar7 = (**(code **)(*(long *)keyl[1].first + 0x10))((long *)keyl[1].first,&local_58);
    puVar3 = auVar7._8_8_;
    unaff_R14 = auVar7._0_8_;
    ppVar6 = (pair<unsigned_long_long,_int> *)(unaff_R14 + 0x328);
    unaff_RBX = 0;
    while (((long)unaff_RBX < (long)*(int *)(unaff_R14 + 0x958) &&
           (bVar2 = std::operator<(ppVar6,keyr), puVar3 = extraout_RDX_00, bVar2))) {
      unaff_RBX = unaff_RBX + 1;
      ppVar6 = ppVar6 + 1;
    }
    if (iVar5 < (int)keyl->first + -1) {
      if ((*(int *)(unaff_R14 + 0x958) <= (int)unaff_RBX) ||
         (bVar2 = std::operator<(keyr,ppVar6), puVar3 = extraout_RDX_01, bVar2)) {
        local_58 = *(undefined8 *)(unaff_R14 + unaff_RBX * 8);
      }
      else {
        local_58 = *(undefined8 *)(unaff_R14 + 8 + unaff_RBX * 8);
      }
    }
    iVar4 = (int)keyl->first;
  }
  do {
    iVar4 = (int)unaff_RBX;
    if (iVar4 == *(int *)(unaff_R14 + 0x958)) {
      if (*(long *)(unaff_R14 + 800) == -1) goto LAB_0010d393;
      unaff_R14 = (**(code **)(*(long *)keyl[1].first + 0x10))
                            ((long *)keyl[1].first,unaff_R14 + 800);
      iVar4 = 0;
    }
    lVar1 = unaff_R14 + (long)iVar4 * 0x10;
    ppVar6 = (pair<unsigned_long_long,_int> *)(lVar1 + 0x328);
    bVar2 = std::operator<(local_50,ppVar6);
    puVar3 = extraout_RDX_02;
    if (bVar2) goto LAB_0010d393;
    local_48.second = *(long *)(unaff_R14 + (long)iVar4 * 8);
    local_48.first.first = ppVar6->first;
    local_48.first._8_8_ = *(undefined8 *)(lVar1 + 0x330);
    vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::push_back
              ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)this,&local_48)
    ;
    unaff_RBX = (ulong)(iVar4 + 1);
    puVar3 = extraout_RDX_03;
  } while( true );
}

Assistant:

vector<value_type> range_query(const Key &keyl, const Key &keyr) {
            vector<value_type> ret;
            if (!depth)return ret;
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], keyl); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(keyl, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            while (1) {
                if (j == x->sz) {
                    if (x->nxt == -1)break;
                    x = file->read(x->nxt);
                    j = 0;
                }
                if (Compare()(keyr, x->keyvalue[j]))break;
                ret.push_back(std::make_pair(x->keyvalue[j], x->val[j]));
                ++j;
            }
            return ret;
        }